

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_hmask.c
# Opt level: O0

void aom_highbd_blend_a64_hmask_c
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,int w,int h,int bd)

{
  uint16_t *src1;
  uint16_t *src0;
  uint16_t *dst;
  int j;
  int i;
  uint32_t src1_stride_local;
  uint8_t *src1_8_local;
  uint32_t src0_stride_local;
  uint8_t *src0_8_local;
  uint32_t dst_stride_local;
  uint8_t *dst_8_local;
  
  for (i = 0; i < h; i = i + 1) {
    for (j = 0; j < w; j = j + 1) {
      *(short *)((long)dst_8 * 2 + (ulong)(i * dst_stride + j) * 2) =
           (short)((int)((uint)mask[j] *
                         (uint)*(ushort *)((long)src0_8 * 2 + (ulong)(i * src0_stride + j) * 2) +
                         (0x40 - (uint)mask[j]) *
                         (uint)*(ushort *)((long)src1_8 * 2 + (ulong)(i * src1_stride + j) * 2) +
                        0x20) >> 6);
    }
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_hmask_c(uint8_t *dst_8, uint32_t dst_stride,
                                  const uint8_t *src0_8, uint32_t src0_stride,
                                  const uint8_t *src1_8, uint32_t src1_stride,
                                  const uint8_t *mask, int w, int h, int bd) {
  int i, j;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);
  const uint16_t *src0 = CONVERT_TO_SHORTPTR(src0_8);
  const uint16_t *src1 = CONVERT_TO_SHORTPTR(src1_8);
  (void)bd;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);

  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      dst[i * dst_stride + j] = AOM_BLEND_A64(
          mask[j], src0[i * src0_stride + j], src1[i * src1_stride + j]);
    }
  }
}